

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_add.cxx
# Opt level: O0

void __thiscall Fl_Menu_::replace(Fl_Menu_ *this,int i,char *str)

{
  int iVar1;
  char *local_20;
  char *str_local;
  int i_local;
  Fl_Menu_ *this_local;
  
  if ((-1 < i) && (iVar1 = size(this), i < iVar1)) {
    if (this->alloc == '\0') {
      copy(this,(EVP_PKEY_CTX *)this->menu_,(EVP_PKEY_CTX *)0x0);
    }
    local_20 = str;
    if (1 < this->alloc) {
      free(this->menu_[i].text);
      local_20 = strdup(str);
    }
    this->menu_[i].text = local_20;
  }
  return;
}

Assistant:

void Fl_Menu_::replace(int i, const char *str) {
  if (i<0 || i>=size()) return;
  if (!alloc) copy(menu_);
  if (alloc > 1) {
    free((void *)menu_[i].text);
    str = strdup(str);
  }
  menu_[i].text = str;
}